

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O1

Vec_Int_t * Acec_RewriteTop(Gia_Man_t *p,Acec_Box_t *pBox)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Wec_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int **ppiVar8;
  uint uVar9;
  ulong uVar10;
  int Out [2];
  int In [3];
  int local_48;
  int local_44;
  int local_40 [4];
  
  pVVar4 = p->vCos;
  uVar9 = pVVar4->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < uVar9) {
    iVar5 = uVar9 + 1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar5 << 2);
  }
  p_00->pArray = piVar2;
  if ((int)uVar9 < 1) {
LAB_00658b73:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar5 = *pVVar4->pArray;
  if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  uVar1 = pBox->vRootLits->nSize;
  if ((int)uVar1 < 1) {
    uVar10 = 0;
  }
  else {
    ppiVar8 = &pBox->vRootLits->pArray->pArray;
    uVar6 = 0;
    do {
      if (*(int *)((long)ppiVar8 + -4) < 1) goto LAB_00658b73;
      if (**ppiVar8 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar10 = uVar6;
      if ((uint)**ppiVar8 >> 1 == iVar5 - (*(uint *)(p->pObjs + iVar5) & 0x1fffffff)) break;
      uVar6 = uVar6 + 1;
      ppiVar8 = ppiVar8 + 2;
      uVar10 = (ulong)uVar1;
    } while (uVar1 != uVar6);
  }
  if ((int)uVar9 <= (int)uVar10) {
    __assert_fail("iStart < Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                  ,0x167,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
  }
  pVVar3 = pBox->vRootLits;
  uVar9 = 0;
  if ((int)uVar10 < pVVar3->nSize) {
    uVar10 = uVar10 & 0xffffffff;
    uVar9 = 0;
    do {
      pVVar4 = pVVar3->pArray;
      local_40[2] = 0;
      local_40[0] = 0;
      local_40[1] = 0;
      iVar5 = pVVar4[uVar10].nSize;
      if (iVar5 < 1) {
        __assert_fail("Vec_IntSize(vLevel) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                      ,0x16c,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
      }
      if (3 < iVar5) {
        __assert_fail("Vec_IntSize(vLevel) <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                      ,0x16d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
      }
      if (iVar5 == 1) {
        Vec_IntPush(p_00,*pVVar4[uVar10].pArray);
      }
      else {
        if (0 < pVVar4[uVar10].nSize) {
          piVar2 = pVVar4[uVar10].pArray;
          lVar7 = 0;
          do {
            local_40[lVar7] = piVar2[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 < pVVar4[uVar10].nSize);
        }
        Acec_InsertFadd(p,local_40,&local_48);
        Vec_IntPush(p_00,local_48);
        pVVar3 = pBox->vRootLits;
        if ((int)(uVar10 + 1) < pVVar3->nSize) {
          pVVar4 = pVVar3->pArray + uVar10 + 1;
        }
        else {
          uVar1 = pVVar3->nCap;
          if (pVVar3->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar3->pArray == (Vec_Int_t *)0x0) {
                pVVar4 = (Vec_Int_t *)malloc(0x100);
              }
              else {
                pVVar4 = (Vec_Int_t *)realloc(pVVar3->pArray,0x100);
              }
              pVVar3->pArray = pVVar4;
              iVar5 = 0x10;
            }
            else {
              iVar5 = uVar1 * 2;
              if (iVar5 <= (int)uVar1) goto LAB_00658aba;
              if (pVVar3->pArray == (Vec_Int_t *)0x0) {
                pVVar4 = (Vec_Int_t *)malloc((ulong)uVar1 << 5);
              }
              else {
                pVVar4 = (Vec_Int_t *)realloc(pVVar3->pArray,(ulong)uVar1 << 5);
              }
              pVVar3->pArray = pVVar4;
            }
            memset(pVVar4 + pVVar3->nCap,0,((long)iVar5 - (long)pVVar3->nCap) * 0x10);
            pVVar3->nCap = iVar5;
          }
LAB_00658aba:
          iVar5 = pVVar3->nSize;
          uVar1 = iVar5 + 1;
          pVVar3->nSize = uVar1;
          if (iVar5 < 0) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          pVVar4 = pVVar3->pArray + ((ulong)uVar1 - 1);
        }
        Vec_IntPush(pVVar4,local_44);
        uVar9 = uVar9 + 1;
      }
      uVar10 = uVar10 + 1;
      pVVar3 = pBox->vRootLits;
    } while ((int)uVar10 < pVVar3->nSize);
  }
  iVar5 = p->vCos->nSize;
  if (p_00->nSize < iVar5) {
    __assert_fail("Vec_IntSize(vRes) >= Gia_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                  ,0x17d,"Vec_Int_t *Acec_RewriteTop(Gia_Man_t *, Acec_Box_t *)");
  }
  p_00->nSize = iVar5;
  printf("Added %d adders for replace CLAs.  ",(ulong)uVar9);
  return p_00;
}

Assistant:

Vec_Int_t * Acec_RewriteTop( Gia_Man_t * p, Acec_Box_t * pBox )
{
    Vec_Int_t * vRes = Vec_IntAlloc( Gia_ManCoNum(p) + 1 );
    Vec_Int_t * vLevel;
    int i, k, iStart, iLit, Driver, Count = 0;
    // determine how much to shift
    Driver = Gia_ObjFaninId0p( p, Gia_ManCo(p, 0) );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, iStart )
        if ( Abc_Lit2Var(Vec_IntEntry(vLevel,0)) == Driver )
            break;
    assert( iStart < Gia_ManCoNum(p) );
    //Vec_WecPrintLits( pBox->vRootLits );
    Vec_WecForEachLevelStart( pBox->vRootLits, vLevel, i, iStart )
    {
        int In[3] = {0}, Out[2];
        assert( Vec_IntSize(vLevel) > 0 );
        assert( Vec_IntSize(vLevel) <= 3 );
        if ( Vec_IntSize(vLevel) == 1 )
        {
            Vec_IntPush( vRes, Vec_IntEntry(vLevel, 0) );
            continue;
        }
        Vec_IntForEachEntry( vLevel, iLit, k )
            In[k] = iLit;
        Acec_InsertFadd( p, In, Out );
        Vec_IntPush( vRes, Out[0] );
        if ( i+1 < Vec_WecSize(pBox->vRootLits) )
            Vec_IntPush( Vec_WecEntry(pBox->vRootLits, i+1), Out[1] );
        else
            Vec_IntPush( Vec_WecPushLevel(pBox->vRootLits), Out[1] );
        Count++;
    }
    assert( Vec_IntSize(vRes) >= Gia_ManCoNum(p) );
    Vec_IntShrink( vRes, Gia_ManCoNum(p) );
    printf( "Added %d adders for replace CLAs.  ", Count );
    return vRes;
}